

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O0

string * __thiscall
wasm::FeatureSet::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureSet *this)

{
  Feature extraout_EDX;
  Feature f;
  undefined1 auVar1 [12];
  string local_50;
  uint local_20;
  undefined1 local_19;
  uint32_t x;
  FeatureSet *this_local;
  string *ret;
  
  local_19 = 0;
  _x = this;
  this_local = (FeatureSet *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 1; (local_20 & 0x3fffff) != 0; local_20 = local_20 << 1) {
    if ((this->features & local_20) != 0) {
      auVar1 = std::__cxx11::string::empty();
      f = auVar1._8_4_;
      if ((auVar1 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        f = extraout_EDX;
      }
      toString_abi_cxx11_(&local_50,(FeatureSet *)(ulong)local_20,f);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
    std::string ret;
    uint32_t x = 1;
    while (x & Feature::All) {
      if (features & x) {
        if (!ret.empty()) {
          ret += ", ";
        }
        ret += toString(Feature(x));
      }
      x <<= 1;
    }
    return ret;
  }